

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void V_InitFontColors(void)

{
  PalEntry PVar1;
  undefined8 uVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uint32 other;
  uint uVar7;
  FName *pFVar8;
  TempColorInfo *pTVar9;
  TempParmInfo *pTVar10;
  TranslationParm *item;
  TranslationMap *__base;
  TempParmInfo *pinfo;
  int local_1c0;
  TranslationMap tmap;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1b4;
  undefined1 local_1b0 [8];
  FScanner sc;
  int local_a8;
  int index;
  int k;
  uint j;
  uint i;
  PalEntry logcolor;
  TempColorInfo cinfo;
  TempParmInfo info;
  int parmchoice;
  int c;
  TArray<TempColorInfo,_TempColorInfo> colorinfo;
  TArray<TempParmInfo,_TempParmInfo> parminfo;
  undefined1 local_40 [8];
  TArray<TranslationParm,_TranslationParm> parms;
  TranslationParm tparm;
  int lastlump;
  int lump;
  TArray<FName,_FName> names;
  
  TArray<FName,_FName>::TArray((TArray<FName,_FName> *)&lastlump);
  stack0xffffffffffffffe0 = 0;
  tparm.RangeStart = 0;
  parms.Most = 0;
  parms.Count = 0;
  TArray<TranslationParm,_TranslationParm>::TArray
            ((TArray<TranslationParm,_TranslationParm> *)local_40);
  TArray<TempParmInfo,_TempParmInfo>::TArray((TArray<TempParmInfo,_TempParmInfo> *)&colorinfo.Most);
  TArray<TempColorInfo,_TempColorInfo>::TArray((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice);
  TempColorInfo::TempColorInfo((TempColorInfo *)&i);
  PalEntry::PalEntry((PalEntry *)&j);
  info.ParmLen[0] = 0xffffffff;
  TArray<TranslationParm,_TranslationParm>::Clear(TranslationParms);
  TArray<TranslationParm,_TranslationParm>::Clear(TranslationParms + 1);
  TArray<TranslationMap,_TranslationMap>::Clear(&TranslationLookup);
  TArray<PalEntry,_PalEntry>::Clear(&TranslationColors);
  do {
    do {
      iVar5 = FWadCollection::FindLump(&Wads,"TEXTCOLO",(int *)(tparm.End + 1),false);
      if (iVar5 == -1) {
        sc.CMode = false;
        sc.StateMode = '\0';
        sc.StateOptions = false;
        sc.Escape = false;
        for (k = 0; uVar7 = TArray<TempColorInfo,_TempColorInfo>::Size
                                      ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice),
            (uint)k < uVar7; k = k + 1) {
          TranslationMap::TranslationMap((TranslationMap *)((long)&pinfo + 4));
          pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                             ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,(ulong)(uint)k);
          FName::operator=((FName *)((long)&pinfo + 4),&pTVar9->Name);
          pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                             ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,(ulong)(uint)k);
          pTVar10 = TArray<TempParmInfo,_TempParmInfo>::operator[]
                              ((TArray<TempParmInfo,_TempParmInfo> *)&colorinfo.Most,
                               (ulong)pTVar9->ParmInfo);
          if (pTVar10->Index < 0) {
            for (local_a8 = 0; local_a8 < 2; local_a8 = local_a8 + 1) {
              for (index = 0; (uint)index < pTVar10->ParmLen[local_a8]; index = index + 1) {
                item = TArray<TranslationParm,_TranslationParm>::operator[]
                                 ((TArray<TranslationParm,_TranslationParm> *)local_40,
                                  (ulong)(pTVar10->StartParm[local_a8] + index));
                TArray<TranslationParm,_TranslationParm>::Push(TranslationParms + local_a8,item);
              }
            }
            pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                               ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,(ulong)(uint)k);
            TArray<PalEntry,_PalEntry>::Push(&TranslationColors,&pTVar9->LogColor);
            pTVar10->Index = sc._252_4_;
            sc._252_4_ = sc._252_4_ + 1;
          }
          local_1c0 = pTVar10->Index;
          TArray<TranslationMap,_TranslationMap>::Push
                    (&TranslationLookup,(TranslationMap *)((long)&pinfo + 4));
        }
        parms.Most._0_2_ = 0xffff;
        TArray<TranslationParm,_TranslationParm>::Push
                  (TranslationParms,(TranslationParm *)&parms.Most);
        TArray<TranslationParm,_TranslationParm>::Push
                  (TranslationParms + 1,(TranslationParm *)&parms.Most);
        __base = TArray<TranslationMap,_TranslationMap>::operator[](&TranslationLookup,0);
        uVar7 = TArray<TranslationMap,_TranslationMap>::Size(&TranslationLookup);
        qsort(__base,(ulong)uVar7,8,TranslationMapCompare);
        NumTextColors._0_1_ = sc.CMode;
        NumTextColors._1_1_ = sc.StateMode;
        NumTextColors._2_1_ = sc.StateOptions;
        NumTextColors._3_1_ = sc.Escape;
        if ((int)sc._252_4_ < 0x16) {
          __assert_fail("NumTextColors >= NUM_TEXT_COLORS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                        ,0x988,"void V_InitFontColors()");
        }
        TArray<TempColorInfo,_TempColorInfo>::~TArray
                  ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice);
        TArray<TempParmInfo,_TempParmInfo>::~TArray
                  ((TArray<TempParmInfo,_TempParmInfo> *)&colorinfo.Most);
        TArray<TranslationParm,_TranslationParm>::~TArray
                  ((TArray<TranslationParm,_TranslationParm> *)local_40);
        TArray<FName,_FName>::~TArray((TArray<FName,_FName> *)&lastlump);
        return;
      }
    } while (((gameinfo.flags & 0x100U) != 0) &&
            (iVar6 = FWadCollection::GetLumpFile(&Wads,iVar5), iVar6 == 1));
    FScanner::FScanner((FScanner *)local_1b0,iVar5);
    while (bVar3 = FScanner::GetString((FScanner *)local_1b0), bVar3) {
      TArray<FName,_FName>::Clear((TArray<FName,_FName> *)&lastlump);
      PalEntry::PalEntry((PalEntry *)&local_1b4.field_0,0xdf,0xdf,0xdf);
      j = local_1b4.d;
      FName::FName((FName *)&tmap.Number,(char *)local_1b0);
      TArray<FName,_FName>::Push((TArray<FName,_FName> *)&lastlump,(FName *)&tmap.Number);
      while( true ) {
        FScanner::MustGetString((FScanner *)local_1b0);
        bVar3 = FScanner::Compare((FScanner *)local_1b0,"{");
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        pFVar8 = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)&lastlump,0);
        bVar3 = FName::operator==(pFVar8,NAME_Untranslated);
        if (bVar3) {
          FScanner::ScriptError
                    ((FScanner *)local_1b0,"The \"untranslated\" color may not have any other names"
                    );
        }
        FName::FName(&tmap.Name,(char *)local_1b0);
        TArray<FName,_FName>::Push((TArray<FName,_FName> *)&lastlump,&tmap.Name);
      }
      info.ParmLen[1] = 0;
      cinfo.ParmInfo =
           TArray<TranslationParm,_TranslationParm>::Size
                     ((TArray<TranslationParm,_TranslationParm> *)local_40);
      cinfo.LogColor.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
      info.StartParm[0] = 0;
      info.StartParm[1] = 0;
      parms.Most = 0xffffffff;
      while( true ) {
        FScanner::MustGetString((FScanner *)local_1b0);
        bVar3 = FScanner::Compare((FScanner *)local_1b0,"}");
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        bVar3 = FScanner::Compare((FScanner *)local_1b0,"Console:");
        if (bVar3) {
          if (info.ParmLen[1] == 1) {
            FScanner::ScriptError
                      ((FScanner *)local_1b0,"Each color may only have one set of console ranges");
          }
          info.ParmLen[1] = 1;
          cinfo.LogColor.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               TArray<TranslationParm,_TranslationParm>::Size
                         ((TArray<TranslationParm,_TranslationParm> *)local_40);
          info.StartParm[0] = (int)cinfo.LogColor.field_0 - cinfo.ParmInfo;
          parms.Most = 0xffffffff;
        }
        else {
          bVar3 = FScanner::Compare((FScanner *)local_1b0,"Flat:");
          if (bVar3) {
            FScanner::MustGetString((FScanner *)local_1b0);
            other = V_GetColor((DWORD *)0x0,(FScanner *)local_1b0);
            PalEntry::operator=((PalEntry *)&j,other);
          }
          else {
            iVar5 = V_GetColor((DWORD *)0x0,(FScanner *)local_1b0);
            uVar2 = parms._8_8_;
            info.Index._2_1_ = (undefined1)((uint)iVar5 >> 0x10);
            parms.Count._0_1_ = info.Index._2_1_;
            info.Index._1_1_ = (undefined1)((uint)iVar5 >> 8);
            parms.Count._1_1_ = info.Index._1_1_;
            info.Index._0_1_ = (undefined1)iVar5;
            parms.Count._3_1_ = SUB81(uVar2,7);
            parms.Count._2_1_ = (undefined1)info.Index;
            info.Index = iVar5;
            FScanner::MustGetString((FScanner *)local_1b0);
            iVar5 = V_GetColor((DWORD *)0x0,(FScanner *)local_1b0);
            info.Index._2_1_ = (undefined1)((uint)iVar5 >> 0x10);
            parms.Count._3_1_ = info.Index._2_1_;
            info.Index._1_1_ = (undefined1)((uint)iVar5 >> 8);
            info.Index._0_1_ = (undefined1)iVar5;
            tparm.RangeStart = CONCAT11((undefined1)info.Index,info.Index._1_1_);
            info.Index = iVar5;
            bVar3 = FScanner::CheckNumber((FScanner *)local_1b0);
            if (bVar3) {
              if (((short)parms.Most == -1) && (sc.StringLen != 0)) {
                FScanner::ScriptError
                          ((FScanner *)local_1b0,"The first color range must start at position 0");
              }
              if ((sc.StringLen < 0) || (0x100 < sc.StringLen)) {
                FScanner::ScriptError
                          ((FScanner *)local_1b0,"The color range must be within positions [0,256]")
                ;
              }
              if (sc.StringLen <= parms.Most._2_2_) {
                FScanner::ScriptError
                          ((FScanner *)local_1b0,
                           "The color range must not start before the previous one ends");
              }
              parms.Most._0_2_ = (undefined2)sc.StringLen;
              FScanner::MustGetNumber((FScanner *)local_1b0);
              if ((sc.StringLen < 0) || (0x100 < sc.StringLen)) {
                FScanner::ScriptError
                          ((FScanner *)local_1b0,"The color range must be within positions [0,256]")
                ;
              }
              if (sc.StringLen <= (short)parms.Most) {
                FScanner::ScriptError
                          ((FScanner *)local_1b0,
                           "The color range end position must be larger than the start position");
              }
              parms.Most._2_2_ = (short)sc.StringLen;
            }
            else {
              sVar4 = parms.Most._2_2_ + 1;
              parms.Most._2_2_ = 0x100;
              parms.Most._0_2_ = sVar4;
              if (0xff < sVar4) {
                FScanner::ScriptError((FScanner *)local_1b0,"The color has too many ranges");
              }
            }
            TArray<TranslationParm,_TranslationParm>::Push
                      ((TArray<TranslationParm,_TranslationParm> *)local_40,
                       (TranslationParm *)&parms.Most);
          }
        }
      }
      uVar7 = TArray<TranslationParm,_TranslationParm>::Size
                        ((TArray<TranslationParm,_TranslationParm> *)local_40);
      info.StartParm[(int)info.ParmLen[1]] = uVar7 - info.StartParm[(long)(int)info.ParmLen[1] + -2]
      ;
      if (info.StartParm[0] == 0) {
        pFVar8 = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)&lastlump,0);
        bVar3 = FName::operator!=(pFVar8,NAME_Untranslated);
        if (bVar3) {
          FScanner::ScriptError
                    ((FScanner *)local_1b0,"There must be at least one normal range for a color");
        }
      }
      else {
        pFVar8 = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)&lastlump,0);
        bVar3 = FName::operator==(pFVar8,NAME_Untranslated);
        if (bVar3) {
          FScanner::ScriptError
                    ((FScanner *)local_1b0,"The \"untranslated\" color must be left undefined");
        }
      }
      if (info.StartParm[1] == 0) {
        pFVar8 = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)&lastlump,0);
        bVar3 = FName::operator!=(pFVar8,NAME_Untranslated);
        if (bVar3) {
          parms.Most = 0x1000000;
          parms.Count = 0xff000000;
          tparm.RangeStart = -1;
          cinfo.LogColor.field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               TArray<TranslationParm,_TranslationParm>::Push
                         ((TArray<TranslationParm,_TranslationParm> *)local_40,
                          (TranslationParm *)&parms.Most);
          info.StartParm[1] = 1;
        }
      }
      logcolor.field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           TArray<TempParmInfo,_TempParmInfo>::Push
                     ((TArray<TempParmInfo,_TempParmInfo> *)&colorinfo.Most,
                      (TempParmInfo *)&cinfo.ParmInfo);
      for (k = 0; uVar7 = TArray<FName,_FName>::Size((TArray<FName,_FName> *)&lastlump),
          (uint)k < uVar7; k = k + 1) {
        for (index = 0;
            uVar7 = TArray<TempColorInfo,_TempColorInfo>::Size
                              ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice),
            (uint)index < uVar7; index = index + 1) {
          pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                             ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,(ulong)(uint)index
                             );
          pFVar8 = TArray<FName,_FName>::operator[]
                             ((TArray<FName,_FName> *)&lastlump,(ulong)(uint)k);
          bVar3 = FName::operator==(&pTVar9->Name,pFVar8);
          PVar1 = logcolor;
          if (bVar3) {
            pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                               ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,
                                (ulong)(uint)index);
            pTVar9->ParmInfo = (uint)PVar1.field_0;
            pTVar9 = TArray<TempColorInfo,_TempColorInfo>::operator[]
                               ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,
                                (ulong)(uint)index);
            (pTVar9->LogColor).field_0.d = j;
            break;
          }
        }
        uVar7 = TArray<TempColorInfo,_TempColorInfo>::Size
                          ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice);
        if (index == uVar7) {
          pFVar8 = TArray<FName,_FName>::operator[]
                             ((TArray<FName,_FName> *)&lastlump,(ulong)(uint)k);
          FName::operator=((FName *)&i,pFVar8);
          cinfo.Name.Index = j;
          TArray<TempColorInfo,_TempColorInfo>::Push
                    ((TArray<TempColorInfo,_TempColorInfo> *)&parmchoice,(TempColorInfo *)&i);
        }
      }
    }
    FScanner::~FScanner((FScanner *)local_1b0);
  } while( true );
}

Assistant:

void V_InitFontColors ()
{
	TArray<FName> names;
	int lump, lastlump = 0;
	TranslationParm tparm = { 0, 0, {0}, {0} };	// Silence GCC (for real with -Wextra )
	TArray<TranslationParm> parms;
	TArray<TempParmInfo> parminfo;
	TArray<TempColorInfo> colorinfo;
	int c, parmchoice;
	TempParmInfo info;
	TempColorInfo cinfo;
	PalEntry logcolor;
	unsigned int i, j;
	int k, index;

	info.Index = -1;

	TranslationParms[0].Clear();
	TranslationParms[1].Clear();
	TranslationLookup.Clear();
	TranslationColors.Clear();

	while ((lump = Wads.FindLump ("TEXTCOLO", &lastlump)) != -1)
	{
		if (gameinfo.flags & GI_NOTEXTCOLOR)
		{
			// Chex3 contains a bad TEXTCOLO lump, probably to force all text to be green.
			// This renders the Gray, Gold, Red and Yellow color range inoperable, some of
			// which are used by the menu. So we have no choice but to skip this lump so that
			// all colors work properly.
			// The text colors should be the end user's choice anyway.
			if (Wads.GetLumpFile(lump) == 1) continue;
		}
		FScanner sc(lump);
		while (sc.GetString())
		{
			names.Clear();

			logcolor = DEFAULT_LOG_COLOR;

			// Everything until the '{' is considered a valid name for the
			// color range.
			names.Push (sc.String);
			while (sc.MustGetString(), !sc.Compare ("{"))
			{
				if (names[0] == NAME_Untranslated)
				{
					sc.ScriptError ("The \"untranslated\" color may not have any other names");
				}
				names.Push (sc.String);
			}

			parmchoice = 0;
			info.StartParm[0] = parms.Size();
			info.StartParm[1] = 0;
			info.ParmLen[1] = info.ParmLen[0] = 0;
			tparm.RangeEnd = tparm.RangeStart = -1;

			while (sc.MustGetString(), !sc.Compare ("}"))
			{
				if (sc.Compare ("Console:"))
				{
					if (parmchoice == 1)
					{
						sc.ScriptError ("Each color may only have one set of console ranges");
					}
					parmchoice = 1;
					info.StartParm[1] = parms.Size();
					info.ParmLen[0] = info.StartParm[1] - info.StartParm[0];
					tparm.RangeEnd = tparm.RangeStart = -1;
				}
				else if (sc.Compare ("Flat:"))
				{
					sc.MustGetString();
					logcolor = V_GetColor (NULL, sc);
				}
				else
				{
					// Get first color
					c = V_GetColor (NULL, sc);
					tparm.Start[0] = RPART(c);
					tparm.Start[1] = GPART(c);
					tparm.Start[2] = BPART(c);

					// Get second color
					sc.MustGetString();
					c = V_GetColor (NULL, sc);
					tparm.End[0] = RPART(c);
					tparm.End[1] = GPART(c);
					tparm.End[2] = BPART(c);

					// Check for range specifier
					if (sc.CheckNumber())
					{
						if (tparm.RangeStart == -1 && sc.Number != 0)
						{
							sc.ScriptError ("The first color range must start at position 0");
						}
						if (sc.Number < 0 || sc.Number > 256)
						{
							sc.ScriptError ("The color range must be within positions [0,256]");
						}
						if (sc.Number <= tparm.RangeEnd)
						{
							sc.ScriptError ("The color range must not start before the previous one ends");
						}
						tparm.RangeStart = sc.Number;

						sc.MustGetNumber();
						if (sc.Number < 0 || sc.Number > 256)
						{
							sc.ScriptError ("The color range must be within positions [0,256]");
						}
						if (sc.Number <= tparm.RangeStart)
						{
							sc.ScriptError ("The color range end position must be larger than the start position");
						}
						tparm.RangeEnd = sc.Number;
					}
					else
					{
						tparm.RangeStart = tparm.RangeEnd + 1;
						tparm.RangeEnd = 256;
						if (tparm.RangeStart >= tparm.RangeEnd)
						{
							sc.ScriptError ("The color has too many ranges");
						}
					}
					parms.Push (tparm);
				}
			}
			info.ParmLen[parmchoice] = parms.Size() - info.StartParm[parmchoice];
			if (info.ParmLen[0] == 0)
			{
				if (names[0] != NAME_Untranslated)
				{
					sc.ScriptError ("There must be at least one normal range for a color");
				}
			}
			else
			{
				if (names[0] == NAME_Untranslated)
				{
					sc.ScriptError ("The \"untranslated\" color must be left undefined");
				}
			}
			if (info.ParmLen[1] == 0 && names[0] != NAME_Untranslated)
			{ // If a console translation is unspecified, make it white, since the console
			  // font has no color information stored with it.
				tparm.RangeStart = 0;
				tparm.RangeEnd = 256;
				tparm.Start[2] = tparm.Start[1] = tparm.Start[0] = 0;
				tparm.End[2] = tparm.End[1] = tparm.End[0] = 255;
				info.StartParm[1] = parms.Push (tparm);
				info.ParmLen[1] = 1;
			}
			cinfo.ParmInfo = parminfo.Push (info);
			// Record this color information for each name it goes by
			for (i = 0; i < names.Size(); ++i)
			{
				// Redefine duplicates in-place
				for (j = 0; j < colorinfo.Size(); ++j)
				{
					if (colorinfo[j].Name == names[i])
					{
						colorinfo[j].ParmInfo = cinfo.ParmInfo;
						colorinfo[j].LogColor = logcolor;
						break;
					}
				}
				if (j == colorinfo.Size())
				{
					cinfo.Name = names[i];
					cinfo.LogColor = logcolor;
					colorinfo.Push (cinfo);
				}
			}
		}
	}
	// Make permananent copies of all the color information we found.
	for (i = 0, index = 0; i < colorinfo.Size(); ++i)
	{
		TranslationMap tmap;
		TempParmInfo *pinfo;

		tmap.Name = colorinfo[i].Name;
		pinfo = &parminfo[colorinfo[i].ParmInfo];
		if (pinfo->Index < 0)
		{
			// Write out the set of remappings for this color.
			for (k = 0; k < 2; ++k)
			{
				for (j = 0; j < pinfo->ParmLen[k]; ++j)
				{
					TranslationParms[k].Push (parms[pinfo->StartParm[k] + j]);
				}
			}
			TranslationColors.Push (colorinfo[i].LogColor);
			pinfo->Index = index++;
		}
		tmap.Number = pinfo->Index;
		TranslationLookup.Push (tmap);
	}
	// Leave a terminating marker at the ends of the lists.
	tparm.RangeStart = -1;
	TranslationParms[0].Push (tparm);
	TranslationParms[1].Push (tparm);
	// Sort the translation lookups for fast binary searching.
	qsort (&TranslationLookup[0], TranslationLookup.Size(), sizeof(TranslationLookup[0]), TranslationMapCompare);

	NumTextColors = index;
	assert (NumTextColors >= NUM_TEXT_COLORS);
}